

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

void __thiscall DnsStats::ExportStatsByIp(DnsStats *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  StatsByIP *this_00;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  StatsByIP **ppSVar10;
  uint uVar11;
  uint uVar12;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  
  uVar6 = 0;
  uVar9 = 0;
  local_64 = 0;
  uVar8 = 0;
  local_5c = 0;
  local_60 = 0;
  uVar7 = 0;
  local_68 = 0;
  local_6c = 0;
  uVar11 = 0;
  uVar12 = 0;
  for (uVar5 = 0; uVar5 < (this->statsByIp).tableSize; uVar5 = uVar5 + 1) {
    ppSVar10 = (this->statsByIp).hashBin + uVar5;
    while (this_00 = *ppSVar10, this_00 != (StatsByIP *)0x0) {
      bVar3 = this_00->query_seen;
      if (this_00->response_seen == true) {
        bVar4 = StatsByIP::IsDoUsed(this_00);
        uVar6 = uVar6 + bVar4;
        uVar9 = uVar9 + !bVar4;
        bVar4 = StatsByIP::IsEdnsSupported(this_00);
        local_64 = local_64 + bVar4;
        uVar8 = uVar8 + !bVar4;
        bVar4 = StatsByIP::IsQnameMinimized(this_00);
        local_5c = local_5c + bVar4;
        local_60 = local_60 + !bVar4;
        if (this_00->nb_recursive_queries == 0) {
          local_6c = local_6c + 1;
        }
        else {
          local_68 = local_68 + 1;
        }
      }
      uVar7 = uVar7 + bVar3;
      uVar1 = this_00->nb_tcp_443;
      uVar2 = this_00->nb_tcp_583;
      uVar11 = (uVar11 - (uVar1 == 0)) + 1;
      uVar12 = (uVar12 - (uVar2 == 0)) + 1;
      ppSVar10 = &this_00->HashNext;
    }
  }
  SubmitRegistryNumberAndCount(this,0x29,0,(ulong)uVar9);
  SubmitRegistryNumberAndCount(this,0x29,1,(ulong)uVar6);
  SubmitRegistryNumberAndCount(this,0x2b,0,(ulong)uVar8);
  SubmitRegistryNumberAndCount(this,0x2b,1,(ulong)local_64);
  SubmitRegistryNumberAndCount(this,0x2c,0,(ulong)local_60);
  SubmitRegistryNumberAndCount(this,0x2c,1,(ulong)local_5c);
  SubmitRegistryNumberAndCount(this,0x41,0,(ulong)local_6c);
  SubmitRegistryNumberAndCount(this,0x41,1,(ulong)local_68);
  SubmitRegistryNumberAndCount(this,0x2e,0,(ulong)uVar7);
  if (this->is_capture_dns_only == false) {
    SubmitRegistryNumberAndCount(this,0x30,0,(ulong)(this->statsByIp).tableSize);
    SubmitRegistryNumberAndCount(this,0x30,0x247,(ulong)uVar12);
    SubmitRegistryNumberAndCount(this,0x30,0x1bb,(ulong)uVar11);
  }
  BinHash<StatsByIP>::Clear(&this->statsByIp);
  return;
}

Assistant:

void DnsStats::ExportStatsByIp()
{
    StatsByIP *sbi;
    uint32_t using_do_count = 0;
    uint32_t not_using_do_count = 0;
    uint32_t using_edns_count = 0;
    uint32_t not_using_edns_count = 0;
    uint32_t qname_minimizing_count = 0;
    uint32_t not_minimizing_count = 0;
    uint32_t total_queries = 0;
    uint32_t issued_syn_583 = 0;
    uint32_t issued_syn_443 = 0;
    uint32_t sending_recursive_count = 0;
    uint32_t not_sending_recursive_count = 0;

    for (uint32_t i = 0; i < statsByIp.GetSize(); i++)
    {
        sbi = statsByIp.GetEntry(i);

        while (sbi != NULL)
        {
            if (sbi->query_seen) {
                total_queries++;
            }

            if (sbi->response_seen) {
                if (sbi->IsDoUsed()) {
                    using_do_count++;
                }
                else {
                    not_using_do_count++;
                }

                if (sbi->IsEdnsSupported()) {
                    using_edns_count++;
                }
                else {
                    not_using_edns_count++;
                }

                if (sbi->IsQnameMinimized()) {
                    qname_minimizing_count++;
                }
                else {
                    not_minimizing_count++;
                }

                if (sbi->nb_recursive_queries > 0) {
                    sending_recursive_count++;
                }
                else {
                    not_sending_recursive_count++;
                }
            }

            if (sbi->nb_tcp_443 > 0) {
                issued_syn_443++;
            }

            if (sbi->nb_tcp_583 > 0) {
                issued_syn_583++;
            }

            sbi = sbi->HashNext;
        }
    }

    SubmitRegistryNumberAndCount(REGISTRY_DNSSEC_Client_Usage, 0, not_using_do_count);
    SubmitRegistryNumberAndCount(REGISTRY_DNSSEC_Client_Usage, 1, using_do_count);

    SubmitRegistryNumberAndCount(REGISTRY_EDNS_Client_Usage, 0, not_using_edns_count);
    SubmitRegistryNumberAndCount(REGISTRY_EDNS_Client_Usage, 1, using_edns_count);

    SubmitRegistryNumberAndCount(REGISTRY_QNAME_MINIMIZATION_Usage, 0, not_minimizing_count);
    SubmitRegistryNumberAndCount(REGISTRY_QNAME_MINIMIZATION_Usage, 1, qname_minimizing_count);

    SubmitRegistryNumberAndCount(REGISTRY_RESOLVER_SENDING_RECURSIVE, 0, not_sending_recursive_count);
    SubmitRegistryNumberAndCount(REGISTRY_RESOLVER_SENDING_RECURSIVE, 1, sending_recursive_count);

    SubmitRegistryNumberAndCount(REGISTRY_EDNS_OPT_USAGE_REF, 0, total_queries);

    if (!is_capture_dns_only) {
        /* Only add these counts if using PCAP directly, not DNSCAP */
        SubmitRegistryNumberAndCount(REGISTRY_TCPSYN_PER_PROTO, 0, statsByIp.GetSize());
        SubmitRegistryNumberAndCount(REGISTRY_TCPSYN_PER_PROTO, 583, issued_syn_583);
        SubmitRegistryNumberAndCount(REGISTRY_TCPSYN_PER_PROTO, 443, issued_syn_443);
    }

    statsByIp.Clear();
}